

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevoluteTranslational.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkRevoluteTranslational::Initialize
          (ChLinkRevoluteTranslational *this,shared_ptr<chrono::ChBody> *body1,
          shared_ptr<chrono::ChBody> *body2,ChCoordsys<double> *csys,double distance)

{
  double dVar1;
  double dVar2;
  double dVar3;
  element_type *peVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar14;
  int iVar15;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  ChBodyFrame *pCVar16;
  ChBodyFrame *pCVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  double dVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  double local_38;
  double dStack_30;
  double local_28;
  
  peVar4 = (body1->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pCVar17 = &peVar4->super_ChBodyFrame;
  if (peVar4 == (element_type *)0x0) {
    pCVar17 = (ChBodyFrame *)0x0;
  }
  (this->super_ChLink).Body1 = pCVar17;
  peVar4 = (body2->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pCVar16 = &peVar4->super_ChBodyFrame;
  if (peVar4 == (element_type *)0x0) {
    pCVar16 = (ChBodyFrame *)0x0;
  }
  (this->super_ChLink).Body2 = pCVar16;
  iVar14 = (*(pCVar17->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])();
  iVar15 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
             _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_par1,(ChVariables *)CONCAT44(extraout_var,iVar14),
             (ChVariables *)CONCAT44(extraout_var_00,iVar15));
  iVar14 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
             _vptr_ChFrame[0x10])();
  iVar15 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
             _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_par2,(ChVariables *)CONCAT44(extraout_var_01,iVar14),
             (ChVariables *)CONCAT44(extraout_var_02,iVar15));
  iVar14 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
             _vptr_ChFrame[0x10])();
  iVar15 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
             _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_dot,(ChVariables *)CONCAT44(extraout_var_03,iVar14),
             (ChVariables *)CONCAT44(extraout_var_04,iVar15));
  iVar14 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
             _vptr_ChFrame[0x10])();
  iVar15 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
             _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_dist,(ChVariables *)CONCAT44(extraout_var_05,iVar14),
             (ChVariables *)CONCAT44(extraout_var_06,iVar15));
  dVar21 = (csys->rot).m_data[1];
  dVar1 = (csys->rot).m_data[0];
  dVar2 = (csys->rot).m_data[2];
  pCVar17 = (this->super_ChLink).Body1;
  dVar3 = (csys->rot).m_data[3];
  ChTransform<double>::TransformParentToLocal
            (&csys->pos,&(pCVar17->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos,
             &(pCVar17->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix);
  if ((ChVector<double> *)&local_38 != &this->m_p1) {
    (this->m_p1).m_data[0] = local_38;
    (this->m_p1).m_data[1] = dStack_30;
    (this->m_p1).m_data[2] = local_28;
  }
  auVar51._8_8_ = 0;
  auVar51._0_8_ = dVar1;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = dVar21;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = dVar3;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = dVar2;
  auVar32 = ZEXT816(0xbff0000000000000);
  auVar38 = ZEXT816(0x4000000000000000);
  pCVar17 = (this->super_ChLink).Body1;
  pCVar16 = (this->super_ChLink).Body2;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar1 * dVar21;
  auVar11 = vfmsub213sd_fma(auVar53,auVar52,auVar18);
  auVar9 = vfmadd231sd_fma(auVar18,auVar52,auVar53);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = dVar1 * dVar3;
  auVar12 = vfmsub213sd_fma(auVar52,auVar49,auVar47);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar3 * dVar3;
  auVar10 = vfmadd231sd_fma(auVar26,auVar51,auVar51);
  dVar3 = auVar11._0_8_ + auVar11._0_8_;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = dVar1 * dVar2;
  auVar11 = vfmadd213sd_fma(auVar53,auVar49,auVar44);
  auVar13 = vfmsub213sd_fma(auVar53,auVar49,auVar44);
  auVar10 = vfmadd213sd_fma(auVar10,auVar38,auVar32);
  dVar1 = auVar12._0_8_ + auVar12._0_8_;
  dVar5 = auVar9._0_8_ + auVar9._0_8_;
  dVar6 = auVar11._0_8_ + auVar11._0_8_;
  auVar11 = vfmadd213sd_fma(auVar52,auVar49,auVar47);
  dVar7 = auVar13._0_8_ + auVar13._0_8_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar2 * dVar2;
  auVar9 = vfmadd231sd_fma(auVar22,auVar51,auVar51);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = dVar21 * dVar21;
  auVar12 = vfmadd231sd_fma(auVar50,auVar51,auVar51);
  dVar21 = auVar11._0_8_ + auVar11._0_8_;
  auVar8 = vfmadd213sd_fma(auVar9,auVar38,auVar32);
  auVar32 = vfmadd213sd_fma(auVar12,auVar38,auVar32);
  auVar39._0_8_ =
       dVar3 * (pCVar17->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
               super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [3];
  auVar39._8_8_ =
       dVar3 * (pCVar17->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
               super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [4];
  auVar42._8_8_ = dVar6;
  auVar42._0_8_ = dVar6;
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       (pCVar17->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar33._8_8_ = 0;
  auVar33._0_8_ =
       dVar3 * (pCVar17->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
               super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [5];
  auVar46._8_8_ = 0;
  auVar46._0_8_ = dVar6;
  auVar12 = vfmadd231sd_fma(auVar33,auVar46,auVar11);
  auVar11 = vfmadd132pd_fma(auVar42,auVar39,
                            *(undefined1 (*) [16])
                             (pCVar17->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                             super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (pCVar17->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
  auVar9 = vfmadd231sd_fma(auVar12,auVar10,auVar9);
  auVar27._0_8_ = auVar10._0_8_;
  auVar27._8_8_ = auVar27._0_8_;
  auVar11 = vfmadd132pd_fma(auVar27,auVar11,
                            *(undefined1 (*) [16])
                             ((pCVar17->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                              super_Matrix<double,_3,_3,_1,_3,_3>.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data.array + 6));
  *(undefined1 (*) [16])(this->m_z1).m_data = auVar11;
  (this->m_z1).m_data[2] = auVar9._0_8_;
  dVar48 = auVar32._0_8_;
  dVar2 = (dVar21 * distance + (csys->pos).m_data[1]) -
          (pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[1];
  dVar3 = (dVar48 * distance + (csys->pos).m_data[0]) -
          (pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[0];
  dVar6 = (distance * dVar7 + (csys->pos).m_data[2]) -
          (pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[2];
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       (pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar3;
  auVar43._8_8_ = 0;
  auVar43._0_8_ =
       dVar2 * (pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
               super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [5];
  auVar11 = vfmadd231sd_fma(auVar43,auVar34,auVar10);
  auVar40._0_8_ =
       dVar2 * (pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
               super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [3];
  auVar40._8_8_ =
       dVar2 * (pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
               super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [4];
  auVar35._8_8_ = dVar3;
  auVar35._0_8_ = dVar3;
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       (pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar6;
  auVar9 = vfmadd231sd_fma(auVar11,auVar28,auVar12);
  auVar29._8_8_ = dVar6;
  auVar29._0_8_ = dVar6;
  auVar11 = vfmadd132pd_fma(auVar35,auVar40,
                            *(undefined1 (*) [16])
                             (pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                             super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array);
  auVar41._8_8_ = dVar48;
  auVar41._0_8_ = dVar48;
  auVar11 = vfmadd132pd_fma(auVar29,auVar11,
                            *(undefined1 (*) [16])
                             ((pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                              super_Matrix<double,_3,_3,_1,_3,_3>.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data.array + 6));
  *(undefined1 (*) [16])(this->m_p2).m_data = auVar11;
  (this->m_p2).m_data[2] = auVar9._0_8_;
  auVar36._0_8_ =
       dVar21 * (pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [3];
  auVar36._8_8_ =
       dVar21 * (pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [4];
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       (pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar30._8_8_ = 0;
  auVar30._0_8_ =
       dVar21 * (pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [5];
  auVar9 = vfmadd231sd_fma(auVar30,auVar32,auVar13);
  auVar11 = vfmadd132pd_fma(auVar41,auVar36,
                            *(undefined1 (*) [16])
                             (pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                             super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array);
  auVar37._8_8_ = dVar7;
  auVar37._0_8_ = dVar7;
  auVar32._8_8_ = 0;
  auVar32._0_8_ =
       (pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar45._8_8_ = 0;
  auVar45._0_8_ = dVar7;
  auVar9 = vfmadd231sd_fma(auVar9,auVar45,auVar32);
  auVar11 = vfmadd132pd_fma(auVar37,auVar11,
                            *(undefined1 (*) [16])
                             ((pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                              super_Matrix<double,_3,_3,_1,_3,_3>.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data.array + 6));
  *(undefined1 (*) [16])(this->m_x2).m_data = auVar11;
  (this->m_x2).m_data[2] = auVar9._0_8_;
  dVar21 = auVar8._0_8_;
  auVar23._0_8_ =
       dVar21 * (pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [3];
  auVar23._8_8_ =
       dVar21 * (pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [4];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar1;
  auVar31._8_8_ = 0;
  auVar31._0_8_ =
       dVar21 * (pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [5];
  auVar9 = vfmadd231sd_fma(auVar31,auVar24,auVar8);
  auVar25._8_8_ = dVar1;
  auVar25._0_8_ = dVar1;
  auVar11 = vfmadd132pd_fma(auVar25,auVar23,
                            *(undefined1 (*) [16])
                             (pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                             super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array);
  auVar38._8_8_ = 0;
  auVar38._0_8_ =
       (pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar5;
  auVar9 = vfmadd231sd_fma(auVar9,auVar19,auVar38);
  auVar20._8_8_ = dVar5;
  auVar20._0_8_ = dVar5;
  auVar11 = vfmadd132pd_fma(auVar20,auVar11,
                            *(undefined1 (*) [16])
                             ((pCVar16->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                              super_Matrix<double,_3,_3,_1,_3,_3>.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data.array + 6));
  *(undefined1 (*) [16])(this->m_y2).m_data = auVar11;
  (this->m_y2).m_data[2] = auVar9._0_8_;
  this->m_dist = distance;
  this->m_cur_dot = 0.0;
  this->m_cur_par1 = 0.0;
  this->m_cur_par2 = 0.0;
  this->m_cur_dist = distance;
  return;
}

Assistant:

void ChLinkRevoluteTranslational::Initialize(std::shared_ptr<ChBody> body1,
                                             std::shared_ptr<ChBody> body2,
                                             const ChCoordsys<>& csys,
                                             double distance) {
    Body1 = body1.get();
    Body2 = body2.get();

    m_cnstr_par1.SetVariables(&Body1->Variables(), &Body2->Variables());
    m_cnstr_par2.SetVariables(&Body1->Variables(), &Body2->Variables());
    m_cnstr_dot.SetVariables(&Body1->Variables(), &Body2->Variables());
    m_cnstr_dist.SetVariables(&Body1->Variables(), &Body2->Variables());

    ChVector<> x_axis = csys.rot.GetXaxis();
    ChVector<> y_axis = csys.rot.GetYaxis();
    ChVector<> z_axis = csys.rot.GetZaxis();

    m_p1 = Body1->TransformPointParentToLocal(csys.pos);
    m_z1 = Body1->TransformDirectionParentToLocal(z_axis);
    m_p2 = Body2->TransformPointParentToLocal(csys.pos + distance * x_axis);
    m_x2 = Body2->TransformDirectionParentToLocal(x_axis);
    m_y2 = Body2->TransformDirectionParentToLocal(y_axis);

    m_dist = distance;

    m_cur_par1 = 0;
    m_cur_par2 = 0;
    m_cur_dot = 0;
    m_cur_dist = distance;
}